

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O1

int leave_block_callback(MD_BLOCKTYPE type,void *detail,void *userdata)

{
  size_t sVar1;
  undefined8 uVar2;
  ulong uVar3;
  char *__s;
  
  switch(type) {
  case MD_BLOCK_QUOTE:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    __s = "</blockquote>\n";
    goto LAB_0010d57c;
  case MD_BLOCK_UL:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    __s = "</ul>\n";
    break;
  case MD_BLOCK_OL:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    __s = "</ol>\n";
    break;
  case MD_BLOCK_LI:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    __s = "</li>\n";
    break;
  default:
    goto switchD_0010d523_caseD_5;
  case MD_BLOCK_H:
    __s = leave_block_callback::head[*detail - 1];
    sVar1 = strlen(__s);
    uVar2 = *(undefined8 *)((long)userdata + 8);
    uVar3 = sVar1 & 0xffffffff;
    goto LAB_0010d5f8;
  case MD_BLOCK_CODE:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    __s = "</code></pre>\n";
LAB_0010d57c:
    uVar3 = 0xe;
    goto LAB_0010d5f8;
  case MD_BLOCK_P:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    __s = "</p>\n";
    uVar3 = 5;
    goto LAB_0010d5f8;
  case MD_BLOCK_TABLE:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    __s = "</table>\n";
    goto LAB_0010d5f3;
  case MD_BLOCK_THEAD:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    __s = "</thead>\n";
    goto LAB_0010d5f3;
  case MD_BLOCK_TBODY:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    __s = "</tbody>\n";
LAB_0010d5f3:
    uVar3 = 9;
    goto LAB_0010d5f8;
  case MD_BLOCK_TR:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    __s = "</tr>\n";
    break;
  case MD_BLOCK_TH:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    __s = "</th>\n";
    break;
  case MD_BLOCK_TD:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    __s = "</td>\n";
  }
  uVar3 = 6;
LAB_0010d5f8:
  (**userdata)(__s,uVar3,uVar2);
switchD_0010d523_caseD_5:
  return 0;
}

Assistant:

static int
leave_block_callback(MD_BLOCKTYPE type, void* detail, void* userdata)
{
    static const MD_CHAR* head[6] = { "</h1>\n", "</h2>\n", "</h3>\n", "</h4>\n", "</h5>\n", "</h6>\n" };
    MD_HTML* r = (MD_HTML*) userdata;

    switch(type) {
        case MD_BLOCK_DOC:      /*noop*/ break;
        case MD_BLOCK_QUOTE:    RENDER_VERBATIM(r, "</blockquote>\n"); break;
        case MD_BLOCK_UL:       RENDER_VERBATIM(r, "</ul>\n"); break;
        case MD_BLOCK_OL:       RENDER_VERBATIM(r, "</ol>\n"); break;
        case MD_BLOCK_LI:       RENDER_VERBATIM(r, "</li>\n"); break;
        case MD_BLOCK_HR:       /*noop*/ break;
        case MD_BLOCK_H:        RENDER_VERBATIM(r, head[((MD_BLOCK_H_DETAIL*)detail)->level - 1]); break;
        case MD_BLOCK_CODE:     RENDER_VERBATIM(r, "</code></pre>\n"); break;
        case MD_BLOCK_HTML:     /* noop */ break;
        case MD_BLOCK_P:        RENDER_VERBATIM(r, "</p>\n"); break;
        case MD_BLOCK_TABLE:    RENDER_VERBATIM(r, "</table>\n"); break;
        case MD_BLOCK_THEAD:    RENDER_VERBATIM(r, "</thead>\n"); break;
        case MD_BLOCK_TBODY:    RENDER_VERBATIM(r, "</tbody>\n"); break;
        case MD_BLOCK_TR:       RENDER_VERBATIM(r, "</tr>\n"); break;
        case MD_BLOCK_TH:       RENDER_VERBATIM(r, "</th>\n"); break;
        case MD_BLOCK_TD:       RENDER_VERBATIM(r, "</td>\n"); break;
    }

    return 0;
}